

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.h
# Opt level: O1

bool FIX::header_order::compare(int x,int y)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  
  uVar3 = 1;
  bVar1 = 1;
  bVar2 = 1;
  uVar5 = 1;
  if (x != 8) {
    if (x == 0x23) {
      uVar5 = 3;
    }
    else {
      if (x != 9) {
        bVar2 = 0;
        uVar5 = 0;
        goto LAB_001374cb;
      }
      uVar5 = 2;
    }
    bVar2 = 1;
  }
LAB_001374cb:
  if (y != 8) {
    if (y == 0x23) {
      uVar3 = 3;
    }
    else if (y == 9) {
      uVar3 = 2;
    }
    else {
      bVar1 = 0;
      uVar3 = 0;
    }
  }
  if ((bool)(bVar2 & bVar1)) {
    return uVar5 < uVar3;
  }
  bVar4 = true;
  if (bVar2 == 0) {
    bVar4 = (bool)((bVar1 ^ 1) & x < y);
  }
  return bVar4;
}

Assistant:

static bool compare(const int x, const int y) {
    int orderedX = getOrderedPosition(x);
    int orderedY = getOrderedPosition(y);

    if (orderedX && orderedY) {
      return orderedX < orderedY;
    } else if (orderedX) {
      return true;
    } else if (orderedY) {
      return false;
    } else {
      return x < y;
    }
  }